

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char **txt)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  ulong *puVar4;
  allocator local_71;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)local_30,*(char **)this,&local_71);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x14bf41);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_60 = *puVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar4;
    local_70 = (ulong *)*plVar2;
  }
  sVar1 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_70 == &local_60) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_58;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_68 = 0;
  local_60 = local_60 & 0xffffffffffffff00;
  local_70 = &local_60;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( char const *   const & txt ) { return "\"" + std::string( txt ) + "\"" ; }